

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

xml_document * xml_open_document(FILE *source)

{
  int iVar1;
  size_t sVar2;
  xml_document *document;
  size_t read;
  uint8_t *buffer;
  size_t buffer_size;
  size_t document_length;
  size_t read_chunk;
  FILE *source_local;
  
  buffer_size = 0;
  buffer = (uint8_t *)0x1;
  read = (size_t)malloc(1);
  while (iVar1 = feof((FILE *)source), iVar1 == 0) {
    if (buffer == (uint8_t *)buffer_size) {
      read = (size_t)realloc((void *)read,(size_t)(buffer + 2));
      buffer = buffer + 2;
    }
    sVar2 = fread((void *)(read + buffer_size),1,1,(FILE *)source);
    buffer_size = sVar2 + buffer_size;
  }
  fclose((FILE *)source);
  source_local = (FILE *)xml_parse_document((uint8_t *)read,buffer_size);
  if (source_local == (FILE *)0x0) {
    free((void *)read);
    source_local = (FILE *)0x0;
  }
  return (xml_document *)source_local;
}

Assistant:

struct xml_document* xml_open_document(FILE* source) {

	/* Prepare buffer
	 */
	size_t const read_chunk = 1; // TODO 4096;

	size_t document_length = 0;
	size_t buffer_size = 1;	// TODO 4069
	uint8_t* buffer = malloc(buffer_size * sizeof(uint8_t));

	/* Read hole file into buffer
	 */
	while (!feof(source)) {

		/* Reallocate buffer
		 */
		if (buffer_size - document_length < read_chunk) {
			buffer = realloc(buffer, buffer_size + 2 * read_chunk);
			buffer_size += 2 * read_chunk;
		}

		size_t read = fread(
			&buffer[document_length],
			sizeof(uint8_t), read_chunk,
			source
		);

		document_length += read;
	}
	fclose(source);

	/* Try to parse buffer
	 */
	struct xml_document* document = xml_parse_document(buffer, document_length);

	if (!document) {
		free(buffer);
		return 0;
	}
	return document;
}